

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O3

void regprint(regex_t *r,FILE *d)

{
  uint *puVar1;
  re_guts *prVar2;
  cat_t *pcVar3;
  bool bVar4;
  uint uVar5;
  void *pvVar6;
  ulong uVar7;
  uint *puVar8;
  char *pcVar9;
  uint uVar10;
  long *plVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int nincat [256];
  uint local_438 [258];
  ulong uVar11;
  
  prVar2 = r->re_g;
  fprintf((FILE *)d,"%ld states, %d categories",prVar2->nstates,(ulong)(uint)prVar2->ncategories);
  fprintf((FILE *)d,", first %ld last %ld",prVar2->firststate,prVar2->laststate);
  uVar5 = prVar2->iflags;
  if ((uVar5 & 1) != 0) {
    fwrite(", USEBOL",8,1,(FILE *)d);
    uVar5 = prVar2->iflags;
  }
  if ((uVar5 & 2) != 0) {
    fwrite(", USEEOL",8,1,(FILE *)d);
    uVar5 = prVar2->iflags;
  }
  if ((uVar5 & 4) != 0) {
    fwrite(", BAD",5,1,(FILE *)d);
  }
  if (prVar2->nsub != 0) {
    fprintf((FILE *)d,", nsub=%ld");
  }
  if (prVar2->must != (char *)0x0) {
    fprintf((FILE *)d,", must(%ld) `%*s\'",(long)prVar2->mlen);
  }
  if (prVar2->backrefs != 0) {
    fwrite(", backrefs",10,1,(FILE *)d);
  }
  if (0 < prVar2->nplus) {
    fprintf((FILE *)d,", nplus %ld");
  }
  fputc(10,(FILE *)d);
  puVar8 = (uint *)prVar2->strip;
  if ((*puVar8 & 0x7c000000) != 0x4000000) {
    fwrite("missing initial OEND!\n",0x16,1,(FILE *)d);
    puVar8 = (uint *)prVar2->strip;
  }
  lVar15 = 2;
  iVar13 = 0;
  do {
    puVar1 = puVar8 + 2;
    puVar8 = puVar8 + 2;
    uVar5 = (uint)*(undefined8 *)puVar1;
    uVar10 = uVar5 & 0x3ffffff;
    uVar11 = (ulong)uVar10;
    uVar7 = (ulong)(uVar5 & 0x7c000000);
    switch(uVar7 - 0x4000000 >> 0x1a) {
    case 0:
      fputc(10,(FILE *)d);
      uVar5 = prVar2->ncategories;
      pcVar3 = prVar2->categories;
      uVar7 = 0;
      do {
        local_438[uVar7] = 0;
        lVar15 = -0x80;
        uVar10 = 0;
        do {
          if (uVar7 == pcVar3[lVar15]) {
            uVar10 = uVar10 + 1;
            local_438[uVar7] = uVar10;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x80);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar5);
      fprintf((FILE *)d,"cc0#%d",(ulong)local_438[0]);
      iVar13 = prVar2->ncategories;
      if (1 < iVar13) {
        uVar7 = 1;
        do {
          if (local_438[uVar7] == 1) {
            lVar15 = -0x80;
            do {
              if (uVar7 == prVar2->categories[lVar15]) goto LAB_0010a7a9;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 0x80);
            lVar15 = 0x80;
LAB_0010a7a9:
            regchar((int)lVar15);
            fprintf((FILE *)d,", %d=%s",uVar7 & 0xffffffff,regchar::buf);
            iVar13 = prVar2->ncategories;
          }
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)iVar13);
      }
      fputc(10,(FILE *)d);
      iVar13 = prVar2->ncategories;
      if (1 < iVar13) {
        uVar7 = 1;
        do {
          if (local_438[uVar7] != 1) {
            fprintf((FILE *)d,"cc%d\t",uVar7 & 0xffffffff);
            iVar13 = -1;
            lVar15 = -0x80;
            iVar14 = -0x81;
            do {
              if ((lVar15 == 0x80) || (uVar7 != prVar2->categories[lVar15])) {
                if (-1 < iVar13) {
                  if (iVar14 != iVar13) {
                    regchar(iVar14);
                    fprintf((FILE *)d,"-%s",regchar::buf);
                  }
                  iVar13 = -1;
                }
              }
              else if (iVar13 < 0) {
                iVar13 = (int)lVar15;
                regchar(iVar13);
                fputs(regchar::buf,(FILE *)d);
              }
              lVar15 = lVar15 + 1;
              iVar14 = iVar14 + 1;
            } while (lVar15 != 0x81);
            fputc(10,(FILE *)d);
            iVar13 = prVar2->ncategories;
          }
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)iVar13);
      }
      return;
    case 1:
      uVar5 = (uint)(char)*(undefined8 *)puVar1;
      pvVar6 = memchr("\\|()^$.[+*?{}!<> ",uVar5,0x12);
      if (pvVar6 == (void *)0x0) {
        regchar(uVar5);
        fputs(regchar::buf,(FILE *)d);
      }
      else {
        fprintf((FILE *)d,"\\%c",(ulong)uVar5);
      }
      break;
    case 2:
      iVar14 = 0x5e;
      goto LAB_0010a676;
    case 3:
      iVar14 = 0x24;
      goto LAB_0010a676;
    case 4:
      iVar14 = 0x2e;
      goto LAB_0010a676;
    case 5:
      fprintf((FILE *)d,"[(%ld)",uVar11);
      iVar14 = prVar2->csetsize;
      if (-1 < iVar14) {
        plVar12 = (long *)((long)&prVar2->sets->ptr + (ulong)(uVar10 << 5));
        uVar10 = 0xffffffff;
        uVar5 = 0;
        do {
          if (((int)uVar5 < iVar14) &&
             ((*(byte *)(plVar12 + 1) & *(byte *)(*plVar12 + (ulong)(uVar5 & 0xff))) != 0)) {
            if ((int)uVar10 < 0) {
              regchar(uVar5);
              fputs(regchar::buf,(FILE *)d);
              uVar10 = uVar5;
            }
          }
          else if (-1 < (int)uVar10) {
            if (uVar5 - 1 != uVar10) {
              regchar(uVar5 - 1);
              fprintf((FILE *)d,"-%s",regchar::buf);
            }
            uVar10 = 0xffffffff;
          }
          iVar14 = prVar2->csetsize;
          bVar4 = (int)uVar5 < iVar14;
          uVar5 = uVar5 + 1;
        } while (bVar4);
      }
      fputc(0x5d,(FILE *)d);
      break;
    case 6:
      pcVar9 = "(\\<%ld>";
      goto LAB_0010a5f4;
    case 7:
      pcVar9 = "<%ld>\\)";
      goto LAB_0010a5f4;
    case 8:
      fwrite("(+",2,1,(FILE *)d);
      if ((puVar8[uVar11 * 2] & 0x7c000000) != 0x28000000) {
LAB_0010a5ea:
        pcVar9 = "<%ld>";
        goto LAB_0010a5f4;
      }
      break;
    case 9:
      if ((*(uint *)((long)puVar8 - (ulong)(uVar10 * 8)) & 0x7c000000) != 0x24000000) {
        fprintf((FILE *)d,"<%ld>",uVar11);
      }
      pcVar9 = "+)";
      goto LAB_0010a4bb;
    case 10:
      fwrite("(?",2,1,(FILE *)d);
      if ((puVar8[uVar11 * 2] & 0x7c000000) != 0x30000000) goto LAB_0010a5ea;
      break;
    case 0xb:
      if ((*(uint *)((long)puVar8 - (ulong)(uVar10 * 8)) & 0x7c000000) != 0x2c000000) {
        fprintf((FILE *)d,"<%ld>",uVar11);
      }
      pcVar9 = "?)";
      goto LAB_0010a4bb;
    case 0xc:
      pcVar9 = "((<%ld>";
      goto LAB_0010a5f4;
    case 0xd:
      pcVar9 = "<%ld>))";
LAB_0010a5f4:
      fprintf((FILE *)d,pcVar9,uVar11);
      break;
    case 0xe:
      fputc(0x3c,(FILE *)d);
      if ((puVar8[uVar11 * 2] & 0x7c000000) != 0x44000000) goto LAB_0010a5ea;
      break;
    case 0xf:
      uVar5 = (uint)*(undefined8 *)((long)puVar8 - (ulong)(uVar10 * 8)) & 0x7c000000;
      if ((uVar5 != 0x3c000000) && (uVar5 != 0x40000000)) {
        fprintf((FILE *)d,"<%ld>",uVar11);
      }
      iVar14 = 0x7c;
      goto LAB_0010a676;
    case 0x10:
      fputc(0x7c,(FILE *)d);
      uVar5 = (uint)*(undefined8 *)(puVar8 + uVar11 * 2) & 0x7c000000;
      if ((uVar5 != 0x44000000) && (uVar5 != 0x48000000)) goto LAB_0010a5ea;
      break;
    case 0x11:
      if ((*(uint *)((long)puVar8 - (ulong)(uVar10 * 8)) & 0x7c000000) != 0x40000000) {
        fprintf((FILE *)d,"<%ld>",uVar11);
      }
      iVar14 = 0x3e;
LAB_0010a676:
      fputc(iVar14,(FILE *)d);
      break;
    case 0x12:
      pcVar9 = "\\{";
      goto LAB_0010a4bb;
    case 0x13:
      pcVar9 = "\\}";
LAB_0010a4bb:
      fwrite(pcVar9,2,1,(FILE *)d);
      break;
    default:
      fprintf((FILE *)d,"!%ld(%ld)!",uVar7,uVar11);
    }
    if ((ulong)(lVar15 * -0x3333333333333333) < 0x3333333333333334) {
      if (iVar13 < 0x29) {
        fputc(0x20,(FILE *)d);
        goto LAB_0010a6d0;
      }
      fwrite("\n\t",2,1,(FILE *)d);
      iVar13 = 0;
    }
    else {
LAB_0010a6d0:
      iVar13 = iVar13 + 1;
    }
    lVar15 = lVar15 + 1;
  } while( true );
}

Assistant:

void
regprint(r, d)
regex_t *r;
FILE *d;
{
	struct re_guts *g = r->re_g;
	int i;
	int c;
	int last;
	int nincat[NC];

	fprintf(d, "%ld states, %d categories", (long)g->nstates,
							g->ncategories);
	fprintf(d, ", first %ld last %ld", (long)g->firststate,
						(long)g->laststate);
	if (g->iflags&USEBOL)
		fprintf(d, ", USEBOL");
	if (g->iflags&USEEOL)
		fprintf(d, ", USEEOL");
	if (g->iflags&BAD)
		fprintf(d, ", BAD");
	if (g->nsub > 0)
		fprintf(d, ", nsub=%ld", (long)g->nsub);
	if (g->must != NULL)
		fprintf(d, ", must(%ld) `%*s'", (long)g->mlen, (int)g->mlen,
								g->must);
	if (g->backrefs)
		fprintf(d, ", backrefs");
	if (g->nplus > 0)
		fprintf(d, ", nplus %ld", (long)g->nplus);
	fprintf(d, "\n");
	s_print(g, d);
	for (i = 0; i < g->ncategories; i++) {
		nincat[i] = 0;
		for (c = CHAR_MIN; c <= CHAR_MAX; c++)
			if (g->categories[c] == i)
				nincat[i]++;
	}
	fprintf(d, "cc0#%d", nincat[0]);
	for (i = 1; i < g->ncategories; i++)
		if (nincat[i] == 1) {
			for (c = CHAR_MIN; c <= CHAR_MAX; c++)
				if (g->categories[c] == i)
					break;
			fprintf(d, ", %d=%s", i, regchar(c));
		}
	fprintf(d, "\n");
	for (i = 1; i < g->ncategories; i++)
		if (nincat[i] != 1) {
			fprintf(d, "cc%d\t", i);
			last = -1;
			for (c = CHAR_MIN; c <= CHAR_MAX+1; c++)	/* +1 does flush */
				if (c <= CHAR_MAX && g->categories[c] == i) {
					if (last < 0) {
						fprintf(d, "%s", regchar(c));
						last = c;
					}
				} else {
					if (last >= 0) {
						if (last != c-1)
							fprintf(d, "-%s",
								regchar(c-1));
						last = -1;
					}
				}
			fprintf(d, "\n");
		}
}